

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O3

double __thiscall HyperLogLog::Assess(HyperLogLog *this)

{
  undefined4 uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  int j;
  long lVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char cVar11;
  char cVar27;
  char cVar28;
  char cVar29;
  undefined1 auVar15 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar12 [11];
  undefined1 auVar18 [16];
  undefined1 auVar24 [16];
  undefined1 auVar13 [12];
  undefined1 auVar19 [16];
  undefined1 auVar14 [13];
  undefined1 auVar20 [16];
  undefined1 auVar25 [16];
  undefined1 auVar22 [16];
  undefined1 auVar21 [16];
  undefined2 uVar30;
  
  dVar6 = 0.0;
  lVar5 = 0;
  do {
    dVar6 = dVar6 + 1.0 / (double)(1 << (this->hllv[lVar5] & 0x1f));
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  dVar6 = (1.0 / dVar6) * 172.288;
  if (dVar6 < 40.0) {
    lVar5 = 0;
    iVar7 = 0;
    iVar8 = 0;
    iVar9 = 0;
    iVar10 = 0;
    do {
      uVar1 = *(undefined4 *)(this->hllv + lVar5);
      cVar11 = -((char)uVar1 == '\0');
      cVar27 = -((char)((uint)uVar1 >> 8) == '\0');
      cVar28 = -((char)((uint)uVar1 >> 0x10) == '\0');
      cVar29 = -((char)((uint)uVar1 >> 0x18) == '\0');
      auVar17._0_9_ = CONCAT18(0xff,0xff00000000000000);
      auVar12._0_10_ = CONCAT19(0xff,auVar17._0_9_);
      auVar12[10] = 0xff;
      auVar13[0xb] = 0xff;
      auVar13._0_11_ = auVar12;
      auVar14[0xc] = 0xff;
      auVar14._0_12_ = auVar13;
      auVar22[0xd] = 0xff;
      auVar22._0_13_ = auVar14;
      auVar22[0xe] = 0xff;
      auVar22[0xf] = 0xff;
      auVar21._14_2_ = auVar22._14_2_;
      auVar21[0xd] = 0xff;
      auVar21._0_13_ = auVar14;
      auVar20._13_3_ = auVar21._13_3_;
      auVar20[0xc] = 0xff;
      auVar20._0_12_ = auVar13;
      auVar19._12_4_ = auVar20._12_4_;
      auVar19[0xb] = 0xff;
      auVar19._0_11_ = auVar12;
      auVar18._11_5_ = auVar19._11_5_;
      auVar18[10] = 0xff;
      auVar18._0_10_ = auVar12._0_10_;
      auVar17._10_6_ = auVar18._10_6_;
      auVar17[9] = 0xff;
      auVar16._9_7_ = auVar17._9_7_;
      auVar16[8] = 0xff;
      auVar16._0_8_ = 0xff00000000000000;
      Var4 = CONCAT91(CONCAT81(auVar16._8_8_,cVar29),cVar29);
      auVar3._2_10_ = Var4;
      auVar3[1] = cVar28;
      auVar3[0] = cVar28;
      auVar2._2_12_ = auVar3;
      auVar2[1] = cVar27;
      auVar2[0] = cVar27;
      auVar15._0_2_ = CONCAT11(cVar11,cVar11);
      auVar15._2_14_ = auVar2;
      uVar30 = (undefined2)Var4;
      auVar25._0_12_ = auVar15._0_12_;
      auVar25._12_2_ = uVar30;
      auVar25._14_2_ = uVar30;
      auVar24._12_4_ = auVar25._12_4_;
      auVar24._0_10_ = auVar15._0_10_;
      auVar24._10_2_ = auVar3._0_2_;
      auVar23._10_6_ = auVar24._10_6_;
      auVar23._0_8_ = auVar15._0_8_;
      auVar23._8_2_ = auVar3._0_2_;
      auVar26._8_8_ = auVar23._8_8_;
      auVar26._6_2_ = auVar2._0_2_;
      auVar26._4_2_ = auVar2._0_2_;
      auVar26._2_2_ = auVar15._0_2_;
      auVar26._0_2_ = auVar15._0_2_;
      auVar26 = auVar26 & _DAT_00183400;
      iVar7 = iVar7 + auVar26._0_4_;
      iVar8 = iVar8 + auVar26._4_4_;
      iVar9 = iVar9 + auVar26._8_4_;
      iVar10 = iVar10 + auVar26._12_4_;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    iVar7 = iVar10 + iVar8 + iVar9 + iVar7;
    if (iVar7 != 0) {
      dVar6 = log(16.0 / (double)iVar7);
      dVar6 = dVar6 * 16.0;
    }
  }
  return dVar6;
}

Assistant:

double HyperLogLog::Assess()
{
    /*
    * First, compute the "indicator" of the m=16 registers
    * Z = 1 / sum (1 / 2^hll[j])
    * The indicator is NOT the same as the harmonic mean. The relation is:
    * harmonic_mean = m * Z
    */
    double divider = 0;
    for (int j = 0; j < 16; j++) {
        divider += 1.0 / ((double)(1 << hllv[j]));
    }
    double Z = 1.0 / divider;

    /*
    * Then, compute E using a precomputed coefficient to correct the bias of the formula
    * E = alpha_m * (m^2) * Z
    * For m = 16, use the precomputed value alpha_m = 0.673
    * 0.673 * (16^2) = 0.673*256 = 172.288
     */
    double E = Z * 172.288;

    /*
    * For small values (E < (5/2)*m , use Linear counting
    */
    if (E < 40.0) {
        int V = 0;
        for (int j = 0; j < 16; j++) {
            if (hllv[j] == 0) {
                V += 1;
            }
        }
        if (V > 0) {
            E = 16 * log(16.0 / (double)V);
        }
    }

    return E;
}